

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * __thiscall
QDir::relativeFilePath(QString *__return_storage_ptr__,QDir *this,QString *fileName)

{
  storage_type_conflict *str;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  byte bVar5;
  long in_FS_OFFSET;
  QLatin1StringView str_00;
  QLatin1StringView other;
  iterator fit;
  iterator dit;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QStringView local_98;
  QStringView local_88;
  QStringTokenizerBase<QStringView,_QChar> local_78;
  QStringTokenizerBase<QStringView,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  absolutePath((QString *)&dit,this);
  cleanPath((QString *)&local_b8,(QString *)&dit);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dit);
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  cleanPath((QString *)&local_d8,fileName);
  bVar4 = isRelativePath((QString *)&local_d8);
  if (!bVar4) {
    bVar4 = isRelativePath((QString *)&local_b8);
    if (!bVar4) {
      (__return_storage_ptr__->d).size = 0;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
      local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_58.m_haystack.m_data = local_b8.ptr;
      local_58.m_haystack.m_size = local_b8.size;
      local_58.m_needle.ucs = L'/';
      local_58._26_6_ = 0xaaaaaaaaaaaa;
      local_78.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
      local_78.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_78.m_haystack.m_data = local_d8.ptr;
      local_78.m_haystack.m_size = local_d8.size;
      local_78.m_needle.ucs = L'/';
      local_78._26_6_ = 0xaaaaaaaaaaaa;
      dit.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      dit.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      dit.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      dit.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      dit.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      dit.tokenizer = (QStringTokenizerBase<QStringView,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
      dit.current.value.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      QStringTokenizerBase<QStringView,_QChar>::iterator::iterator(&dit,&local_58);
      fit.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      fit.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      fit.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      fit.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      fit.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      fit.tokenizer = (QStringTokenizerBase<QStringView,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
      fit.current.value.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      QStringTokenizerBase<QStringView,_QChar>::iterator::iterator(&fit,&local_78);
      while ((dit.current.ok == true && (fit.current.ok == true))) {
        local_88.m_data = dit.current.value.m_data;
        local_88.m_size = dit.current.value.m_size;
        local_98.m_data = fit.current.value.m_data;
        local_98.m_size = fit.current.value.m_size;
        bVar4 = comparesEqual(&local_88,&local_98);
        if (!bVar4) break;
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&dit);
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&fit);
      }
      while (dit.current.ok == true) {
        str_00.m_size = 3;
        str_00.m_data = "../";
        QString::append(__return_storage_ptr__,str_00);
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&dit);
      }
      if (fit.current.ok == true) {
        bVar5 = 1;
        while (qVar1 = fit.current.value.m_size, str = fit.current.value.m_data, (bVar5 & 1) != 0) {
          QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&fit);
          QString::append(__return_storage_ptr__,(QChar *)str,qVar1);
          QString::append(__return_storage_ptr__,(QChar)0x2f);
          bVar5 = fit.current.ok;
        }
        QString::chop(__return_storage_ptr__,1);
      }
      if ((__return_storage_ptr__->d).size == 0) {
        other.m_size = 1;
        other.m_data = ".";
        QString::operator=(__return_storage_ptr__,other);
      }
      goto LAB_00137873;
    }
  }
  qVar1 = local_d8.size;
  pcVar3 = local_d8.ptr;
  pDVar2 = local_d8.d;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pcVar3;
  local_d8.size = 0;
  (__return_storage_ptr__->d).size = qVar1;
LAB_00137873:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::relativeFilePath(const QString &fileName) const
{
    QString dir = cleanPath(absolutePath());
    QString file = cleanPath(fileName);

    if (isRelativePath(file) || isRelativePath(dir))
        return file;

#ifdef Q_OS_WIN
    QString dirDrive = driveSpec(dir);
    QString fileDrive = driveSpec(file);

    bool fileDriveMissing = false;
    if (fileDrive.isEmpty()) {
        fileDrive = dirDrive;
        fileDriveMissing = true;
    }

    if (fileDrive.toLower() != dirDrive.toLower()
            || (file.startsWith("//"_L1)
                && !dir.startsWith("//"_L1))) {
        return file;
    }

    dir.remove(0, dirDrive.size());
    if (!fileDriveMissing)
        file.remove(0, fileDrive.size());
#endif

    QString result;
    const auto dirElts = dir.tokenize(u'/', Qt::SkipEmptyParts);
    const auto fileElts = file.tokenize(u'/', Qt::SkipEmptyParts);

    const auto dend = dirElts.end();
    const auto fend = fileElts.end();
    auto dit = dirElts.begin();
    auto fit = fileElts.begin();

    const auto eq = [](QStringView lhs, QStringView rhs) {
        return
#if defined(Q_OS_WIN)
           lhs.compare(rhs, Qt::CaseInsensitive) == 0;
#else
           lhs == rhs;
#endif
    };

    // std::ranges::mismatch
    while (dit != dend && fit != fend && eq(*dit, *fit)) {
        ++dit;
        ++fit;
    }

    while (dit != dend) {
        result += "../"_L1;
        ++dit;
    }

    if (fit != fend) {
        while (fit != fend) {
            result += *fit++;
            result += u'/';
        }
        result.chop(1);
    }

    if (result.isEmpty())
        result = "."_L1;
    return result;
}